

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O3

int wally_ec_sig_normalize(uchar *sig,size_t sig_len,uchar *bytes_out,size_t len)

{
  secp256k1_context *ctx;
  int iVar1;
  bool bVar2;
  bool bVar3;
  secp256k1_ecdsa_signature sig_secp;
  secp256k1_ecdsa_signature sig_low;
  secp256k1_ecdsa_signature sStack_a8;
  secp256k1_ecdsa_signature local_68;
  
  ctx = secp256k1_context_no_precomp;
  bVar2 = false;
  bVar3 = false;
  if ((((bytes_out != (uchar *)0x0) && (bVar3 = bVar2, sig != (uchar *)0x0)) && (sig_len == 0x40))
     && (len == 0x40)) {
    iVar1 = secp256k1_ecdsa_signature_parse_compact(secp256k1_context_no_precomp,&sStack_a8,sig);
    if (iVar1 == 0) {
      bVar3 = false;
    }
    else {
      secp256k1_ecdsa_signature_normalize(ctx,&local_68,&sStack_a8);
      iVar1 = secp256k1_ecdsa_signature_serialize_compact(ctx,bytes_out,&local_68);
      bVar3 = iVar1 != 0;
    }
  }
  if (bytes_out != (uchar *)0x0 && bVar3 == false) {
    wally_clear(bytes_out,len);
  }
  wally_clear_2(&sStack_a8,0x40,&local_68,0x40);
  return (uint)bVar3 * 2 + -2;
}

Assistant:

int wally_ec_sig_normalize(const unsigned char *sig, size_t sig_len,
                           unsigned char *bytes_out, size_t len)
{
    secp256k1_ecdsa_signature sig_secp, sig_low;
    const secp256k1_context *ctx = secp256k1_context_no_precomp;
    bool ok;

    ok = sig && sig_len == EC_SIGNATURE_LEN &&
         bytes_out && len == EC_SIGNATURE_LEN &&
         secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig);

    if (ok) {
        /* Note no error is returned, just whether the sig was changed */
        secp256k1_ecdsa_signature_normalize(ctx, &sig_low, &sig_secp);

        ok = secp256k1_ecdsa_signature_serialize_compact(ctx, bytes_out,
                                                         &sig_low);
    }

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear_2(&sig_secp, sizeof(sig_secp), &sig_low, sizeof(sig_low));
    return ok ? WALLY_OK : WALLY_EINVAL;
}